

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

void __thiscall imrt::Station::initializeStation(Station *this,int type,int open_apertures)

{
  int iVar1;
  reference pvVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double dVar6;
  int i_7;
  int i_6;
  int sel;
  int k;
  vector<int,_std::allocator<int>_> levels;
  int i_5;
  int i_4;
  int j_3;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> aux_3;
  int i_3;
  int index2;
  int index1;
  pair<int,_int> range;
  int j_2;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> aux_2;
  int i_2;
  int j_1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> aux_1;
  int i_1;
  int j;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> aux;
  int i;
  Collimator *in_stack_fffffffffffffe28;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_fffffffffffffe30;
  value_type_conflict2 *in_stack_fffffffffffffe38;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  int iVar7;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  vector<int,_std::allocator<int>_> local_128;
  int local_10c;
  int local_108;
  undefined4 local_104;
  undefined4 local_100;
  pair<int,_int> local_fc;
  pair<int,_int> local_f4;
  int local_ec;
  int local_d0;
  pair<int,_int> local_cc;
  int local_c4;
  pair<int,_int> local_c0;
  int local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  pair<int,_int> local_ac;
  pair<int,_int> local_a4;
  int local_9c;
  int local_80;
  undefined4 local_7c;
  undefined4 local_78;
  pair<int,_int> local_74;
  int local_6c;
  int local_50;
  pair<int,_int> local_4c;
  int local_34;
  int local_14;
  int local_10;
  int local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  if ((in_ESI == 1) || (in_ESI == 0)) {
    for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x40); local_14 = local_14 + 1) {
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x13ce65);
      for (local_34 = 0; iVar7 = local_34,
          iVar1 = Collimator::getXdim(*(Collimator **)(in_RDI + 0xb0)), iVar7 < iVar1;
          local_34 = local_34 + 1) {
        local_4c = Collimator::getActiveRange(in_stack_fffffffffffffe28,0,0x13cecf);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                  (in_stack_fffffffffffffe30,(value_type *)in_stack_fffffffffffffe28);
      }
      std::
      vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
      ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                    *)(in_RDI + 0x58),(long)local_14);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 in_stack_fffffffffffffe40);
    }
  }
  else if ((in_ESI == 3) || (in_ESI == 2)) {
    for (local_50 = 0; local_50 < *(int *)(in_RDI + 0x40); local_50 = local_50 + 1) {
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x13cfd9);
      for (local_6c = 0; iVar7 = local_6c,
          iVar1 = Collimator::getXdim(*(Collimator **)(in_RDI + 0xb0)), iVar7 < iVar1;
          local_6c = local_6c + 1) {
        local_78 = 0xffffffff;
        local_7c = 0xffffffff;
        local_74 = std::make_pair<int,int>((int *)in_stack_fffffffffffffe28,(int *)0x13d050);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                  (in_stack_fffffffffffffe30,(value_type *)in_stack_fffffffffffffe28);
      }
      std::
      vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
      ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                    *)(in_RDI + 0x58),(long)local_50);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 in_stack_fffffffffffffe40);
    }
  }
  else if (in_ESI == 4) {
    for (local_80 = 0; local_80 < *(int *)(in_RDI + 0x40); local_80 = local_80 + 1) {
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x13d14a);
      for (local_9c = 0; iVar7 = local_9c,
          iVar1 = Collimator::getXdim(*(Collimator **)(in_RDI + 0xb0)), iVar7 < iVar1;
          local_9c = local_9c + 1) {
        local_a4 = Collimator::getActiveRange(in_stack_fffffffffffffe28,0,0x13d1a8);
        iVar7 = local_a4.first;
        if (local_a4.first < 0) {
          local_b0 = 0xffffffff;
          local_b4 = 0xffffffff;
          local_ac = std::make_pair<int,int>((int *)in_stack_fffffffffffffe28,(int *)0x13d1f5);
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                    (in_stack_fffffffffffffe30,(value_type *)in_stack_fffffffffffffe28);
        }
        else {
          iVar1 = rand();
          iVar7 = iVar7 + iVar1 % ((local_a4.second - local_a4.first) + 1);
          local_b8 = iVar7;
          if (iVar7 == local_a4.second) {
            local_c0 = std::make_pair<int&,int&>((int *)in_stack_fffffffffffffe28,(int *)0x13d29c);
            std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                      (in_stack_fffffffffffffe30,(value_type *)in_stack_fffffffffffffe28);
          }
          else {
            iVar1 = rand();
            local_c4 = iVar7 + iVar1 % ((local_a4.second - local_b8) + 1);
            local_cc = std::make_pair<int&,int&>((int *)in_stack_fffffffffffffe28,(int *)0x13d310);
            std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                      (in_stack_fffffffffffffe30,(value_type *)in_stack_fffffffffffffe28);
          }
        }
      }
      std::
      vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
      ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                    *)(in_RDI + 0x58),(long)local_80);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 in_stack_fffffffffffffe40);
    }
  }
  else {
    for (local_d0 = 0; local_d0 < *(int *)(in_RDI + 0x40); local_d0 = local_d0 + 1) {
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x13d3d8);
      local_ec = 0;
      while (in_stack_fffffffffffffe64 = local_ec,
            iVar7 = Collimator::getXdim(*(Collimator **)(in_RDI + 0xb0)),
            in_stack_fffffffffffffe64 < iVar7) {
        if (local_10 < 1) {
          local_100 = 0xffffffff;
          local_104 = 0xffffffff;
          local_fc = std::make_pair<int,int>((int *)in_stack_fffffffffffffe28,(int *)0x13d4be);
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                    (in_stack_fffffffffffffe30,(value_type *)in_stack_fffffffffffffe28);
        }
        else {
          local_f4 = Collimator::getActiveRange(in_stack_fffffffffffffe28,0,0x13d440);
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                    (in_stack_fffffffffffffe30,(value_type *)in_stack_fffffffffffffe28);
        }
        local_ec = local_ec + 1;
      }
      local_10 = local_10 + -1;
      std::
      vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
      ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                    *)(in_RDI + 0x58),(long)local_d0);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 in_stack_fffffffffffffe40);
    }
  }
  if ((local_c == 0) || (local_c == 2)) {
    for (local_108 = 0; local_108 < *(int *)(in_RDI + 0x40); local_108 = local_108 + 1) {
      iVar7 = *(int *)(in_RDI + 0x48);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 200),(long)local_108)
      ;
      *pvVar2 = (double)iVar7;
    }
  }
  else if ((local_c == 1) || (local_c == 3)) {
    for (local_10c = 0; local_10c < *(int *)(in_RDI + 0x40); local_10c = local_10c + 1) {
      dVar6 = (double)*(int *)(in_RDI + 0x44);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 200),(long)local_10c)
      ;
      *pvVar2 = dVar6;
    }
  }
  else if (local_c == 4) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x13d67a);
    for (in_stack_fffffffffffffed4 = 0; in_stack_fffffffffffffed4 <= *(int *)(in_RDI + 0x44);
        in_stack_fffffffffffffed4 = in_stack_fffffffffffffed4 + *(int *)(in_RDI + 0x50)) {
      std::vector<int,_std::allocator<int>_>::push_back
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    }
    for (iVar7 = 0; iVar7 < *(int *)(in_RDI + 0x40); iVar7 = iVar7 + 1) {
      iVar1 = rand();
      uVar3 = (ulong)iVar1;
      sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_128);
      in_stack_fffffffffffffed0 = (int)(uVar3 % (sVar4 + 1));
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&local_128,(long)in_stack_fffffffffffffed0);
      dVar6 = (double)*pvVar5;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 200),(long)iVar7);
      *pvVar2 = dVar6;
    }
    std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffe40);
  }
  else {
    for (iVar7 = 0; iVar7 < *(int *)(in_RDI + 0x40); iVar7 = iVar7 + 1) {
      dVar6 = (double)*(int *)(in_RDI + 0x4c);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 200),(long)iVar7);
      *pvVar2 = dVar6;
    }
  }
  if (local_c == 5) {
    generate_random_intensities
              ((Station *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  }
  else {
    generateIntensity((Station *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  }
  return;
}

Assistant:

void Station::initializeStation(int type, int open_apertures) {
    // Generating aperture patterns


    if (type==OPEN_MAX_SETUP || type==OPEN_MIN_SETUP) {
      for (int i=0; i<max_apertures; i++) {
        vector<pair<int,int> > aux;
        for (int j=0; j<collimator.getXdim(); j++){
          aux.push_back(collimator.getActiveRange(j,angle));
        }
	      A[i] =aux;
      }
    } else if (type==CLOSED_MAX_SETUP || type==CLOSED_MIN_SETUP) {
      for (int i=0; i<max_apertures; i++){
        vector<pair<int,int> > aux;
        for (int j=0; j<collimator.getXdim(); j++)
          aux.push_back(make_pair(-1,-1));
        A[i] = aux;
      }
    } else if (type==RAND_RAND_SETUP) {
      for (int i=0; i<max_apertures; i++) {
        vector<pair<int,int> > aux;
        for (int j=0; j<collimator.getXdim(); j++) {
          pair<int, int> range = collimator.getActiveRange(j,angle);
          if (range.first<0) {
            aux.push_back(make_pair(-1,-1));
            continue;
          }
          int index1 = range.first + rand() % (range.second-range.first+1);
          if (index1 == range.second) {
            aux.push_back(make_pair(range.second,range.second));
          } else {
            int index2 = index1 + rand() % (range.second-index1+1);
            aux.push_back(make_pair(index1,index2));
          }
        }
        A[i]=aux;
      }
    } else {
      //Keeping this for backwards compatibility
      for (int i=0; i<max_apertures; i++) {
        vector<pair<int,int> > aux;
        for (int j=0; j<collimator.getXdim(); j++) {
          if (open_apertures>0)
            aux.push_back(collimator.getActiveRange(j,angle));
          else
            aux.push_back(make_pair(-1,-1));
        }
        open_apertures--;
        A[i]=aux;
      }
    }

    // Generating intensity
    if (type==OPEN_MIN_SETUP || type==CLOSED_MIN_SETUP) {
      for (int i=0; i<max_apertures; i++)
        intensity[i] = min_intensity;
    } else if (type==OPEN_MAX_SETUP || type==CLOSED_MAX_SETUP) {
      for (int i=0; i<max_apertures; i++)
        intensity[i] = max_intensity;
    } else if (type==RAND_RAND_SETUP) {
      vector<int> levels;
      for (int k=0; k<=max_intensity; k=k+step_intensity)
        levels.push_back(k);
      int sel;
      for (int i=0; i<max_apertures; i++) {
        sel = (rand() %  (levels.size()+1));
        intensity[i] = levels[sel];
      }
    } else {
      for (int i=0; i<max_apertures; i++)
        intensity[i] = initial_intensity;
    }

    if(type==RAND_INTENSITIES)
      generate_random_intensities();
    else
      generateIntensity();
  }